

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManHighLightFlopLogic(Gia_Man_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  iVar10 = p->nRegs;
  pVVar7 = p->vCis;
  iVar5 = pVVar7->nSize;
  if (iVar10 < iVar5) {
    lVar6 = 0;
    do {
      if (iVar5 <= lVar6) goto LAB_001f740a;
      iVar5 = pVVar7->pArray[lVar6];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001f73eb;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar5].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar6 = lVar6 + 1;
      iVar10 = p->nRegs;
      pVVar7 = p->vCis;
      iVar5 = pVVar7->nSize;
    } while (lVar6 < iVar5 - iVar10);
  }
  if (0 < iVar10) {
    iVar5 = 0;
    do {
      iVar2 = p->vCis->nSize;
      uVar8 = (iVar2 - iVar10) + iVar5;
      if (((int)uVar8 < 0) || (iVar2 <= (int)uVar8)) {
LAB_001f740a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = p->vCis->pArray[uVar8];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_001f73eb;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar10].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      iVar5 = iVar5 + 1;
      iVar10 = p->nRegs;
    } while (iVar5 < iVar10);
  }
  iVar10 = p->nObjs;
  if (0 < iVar10) {
    lVar6 = 0;
    lVar9 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)(&pGVar3->field_0x0 + lVar6);
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
        *(ulong *)(&pGVar3->field_0x0 + lVar6) =
             uVar4 & 0xffffffff3fffffff |
             (ulong)((*(uint *)((long)pGVar3 +
                               (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3 + lVar6) |
                     *(uint *)((long)pGVar3 +
                              (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3 + lVar6)) &
                    0x40000000);
        iVar10 = p->nObjs;
      }
      lVar9 = lVar9 + 1;
      lVar6 = lVar6 + 0xc;
    } while (lVar9 < iVar10);
  }
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    lVar6 = 0;
    do {
      iVar10 = pVVar7->pArray[lVar6];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_001f73eb:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar3 = p->pObjs + iVar10;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)((uint)*(undefined8 *)(pGVar3 + -(ulong)((uint)*(ulong *)pGVar3 & 0x1fffffff)) &
                  0x40000000);
      lVar6 = lVar6 + 1;
      pVVar7 = p->vCos;
    } while (lVar6 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Gia_ManHighLightFlopLogic( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->fMark0 = 1;
    Gia_ManForEachAnd( p, pObj, i )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 | Gia_ObjFanin1(pObj)->fMark0;
    Gia_ManForEachCo( p, pObj, i )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0;
}